

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

uintmax_t ghc::filesystem::remove_all(path *p,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  error_category *peVar4;
  uintmax_t uVar5;
  long lVar6;
  uintmax_t uVar7;
  directory_iterator iter;
  directory_iterator local_68;
  file_status fs;
  error_code tec;
  
  std::error_code::clear(ec);
  path::path<char[2],ghc::filesystem::path>((path *)&tec,(char (*) [2])"/",auto_format);
  bVar1 = operator==(p,(path *)&tec);
  std::__cxx11::string::~string((string *)&tec);
  if (bVar1) {
    peVar4 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0x5f;
    ec->_M_cat = peVar4;
    uVar7 = 0xffffffffffffffff;
  }
  else {
    tec._M_value = 0;
    tec._M_cat = (error_category *)std::_V2::system_category();
    symlink_status((path *)&fs,(error_code *)p);
    uVar7 = 0xffffffffffffffff;
    if (fs._type == directory) {
      directory_iterator::directory_iterator(&iter,p,ec);
      lVar6 = 0;
      while( true ) {
        directory_iterator::directory_iterator(&local_68);
        bVar2 = operator!=(&((iter._impl.
                              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_dir_entry)._path,
                           &((local_68._impl.
                              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_dir_entry)._path);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_68._impl.
                    super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        bVar1 = true;
        if (((!bVar2) || (0x14 < (uint)ec->_M_value)) ||
           ((0x100005U >> (ec->_M_value & 0x1fU) & 1) == 0)) goto LAB_00158ed2;
        bVar1 = directory_entry::is_symlink
                          (&(iter._impl.
                             super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_dir_entry,ec);
        if (ec->_M_value != 0) goto LAB_00158ed0;
        if (!bVar1) break;
LAB_00158e9b:
        remove((filesystem *)
               &(iter._impl.
                 super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_dir_entry,(char *)ec);
        lVar6 = lVar6 + (ulong)(ec->_M_value == 0);
        if (ec->_M_value != 0) goto LAB_00158ed0;
LAB_00158ebb:
        directory_iterator::increment(&iter,ec);
      }
      bVar1 = directory_entry::is_directory
                        (&(iter._impl.
                           super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_dir_entry,ec);
      if (bVar1) {
        uVar5 = remove_all(&((iter._impl.
                              super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_dir_entry)._path,ec);
        lVar6 = lVar6 + uVar5;
        if (ec->_M_value == 0) goto LAB_00158ebb;
      }
      else if (ec->_M_value == 0) goto LAB_00158e9b;
LAB_00158ed0:
      bVar1 = false;
LAB_00158ed2:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&iter._impl.
                  super___shared_ptr<ghc::filesystem::directory_iterator::impl,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      if (!bVar1) {
        return 0xffffffffffffffff;
      }
    }
    else {
      lVar6 = 0;
    }
    if (ec->_M_value == 0) {
      uVar3 = remove((filesystem *)p,(char *)ec);
      uVar7 = -(ulong)(ec->_M_value != 0) | lVar6 + (ulong)(uVar3 & 0xff);
    }
  }
  return uVar7;
}

Assistant:

GHC_INLINE uintmax_t remove_all(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
    uintmax_t count = 0;
    if (p == "/") {
        ec = detail::make_error_code(detail::portable_error::not_supported);
        return static_cast<uintmax_t>(-1);
    }
    std::error_code tec;
    auto fs = symlink_status(p, tec);
    if (exists(fs) && is_directory(fs)) {
        for (auto iter = directory_iterator(p, ec); iter != directory_iterator(); iter.increment(ec)) {
            if (ec && !detail::is_not_found_error(ec)) {
                break;
            }
            bool is_symlink_result = iter->is_symlink(ec);
            if (ec)
                return static_cast<uintmax_t>(-1);
            if (!is_symlink_result && iter->is_directory(ec)) {
                count += remove_all(iter->path(), ec);
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
            }
            else {
                if (!ec) {
                    remove(iter->path(), ec);
                }
                if (ec) {
                    return static_cast<uintmax_t>(-1);
                }
                ++count;
            }
        }
    }
    if (!ec) {
        if (remove(p, ec)) {
            ++count;
        }
    }
    if (ec) {
        return static_cast<uintmax_t>(-1);
    }
    return count;
}